

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_resetCCtx_internal
                 (ZSTD_CCtx *zc,ZSTD_CCtx_params *params,U64 pledgedSrcSize,size_t loadedDictSize,
                 ZSTD_compResetPolicy_e crp,ZSTD_buffered_policy_e zbuff)

{
  ZSTD_window_t w;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ZSTD_cwksp *ws_00;
  ulong bytes;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  ZSTD_compressedBlockState_t *pZVar13;
  U32 *pUVar14;
  BYTE *pBVar15;
  size_t bytes_00;
  seqDef *psVar16;
  long lVar17;
  ldmEntry_t *plVar18;
  rawSeq *prVar19;
  bool bVar20;
  undefined6 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff06;
  undefined1 in_stack_ffffffffffffff07;
  size_t local_f8;
  size_t local_f0;
  ulong local_e8;
  U64 local_e0;
  ulong local_d8;
  U64 local_d0;
  size_t ldmHSize;
  size_t err_code_2;
  size_t numBuckets;
  size_t err_code_1;
  int workspaceWasteful;
  int workspaceTooSmall;
  size_t err_code;
  int resizeWorkspace;
  size_t neededSpace;
  ZSTD_indexResetPolicy_e needsIndexReset;
  int dictTooBig;
  int indexTooClose;
  size_t maxNbLdmSeq;
  size_t buffInSize;
  size_t buffOutSize;
  size_t maxNbSeq;
  U32 divider;
  size_t blockSize;
  size_t windowSize;
  ZSTD_cwksp *ws;
  ZSTD_buffered_policy_e zbuff_local;
  ZSTD_compResetPolicy_e crp_local;
  size_t loadedDictSize_local;
  U64 pledgedSrcSize_local;
  ZSTD_CCtx_params *params_local;
  ZSTD_CCtx *zc_local;
  
  ws_00 = &zc->workspace;
  zc->isFirstBlock = 1;
  memcpy(&zc->appliedParams,params,0xb0);
  if ((zc->appliedParams).ldmParams.enableLdm != 0) {
    ZSTD_ldm_adjustParameters(&(zc->appliedParams).ldmParams,&(zc->appliedParams).cParams);
  }
  local_d0 = pledgedSrcSize;
  if ((ulong)(1L << ((byte)(zc->appliedParams).cParams.windowLog & 0x3f)) < pledgedSrcSize) {
    local_d0 = 1L << ((byte)(zc->appliedParams).cParams.windowLog & 0x3f);
  }
  if (local_d0 == 0) {
    local_d8 = 1;
  }
  else {
    local_e0 = pledgedSrcSize;
    if ((ulong)(1L << ((byte)(zc->appliedParams).cParams.windowLog & 0x3f)) < pledgedSrcSize) {
      local_e0 = 1L << ((byte)(zc->appliedParams).cParams.windowLog & 0x3f);
    }
    local_d8 = local_e0;
  }
  if (local_d8 < 0x20001) {
    local_e8 = local_d8;
  }
  else {
    local_e8 = 0x20000;
  }
  uVar9 = 4;
  if ((zc->appliedParams).cParams.minMatch == 3) {
    uVar9 = 3;
  }
  bytes = local_e8 / uVar9;
  if ((zbuff == ZSTDb_buffered) && ((zc->appliedParams).outBufferMode == ZSTD_bm_buffered)) {
    local_f0 = ZSTD_compressBound(local_e8);
    local_f0 = local_f0 + 1;
  }
  else {
    local_f0 = 0;
  }
  if ((zbuff == ZSTDb_buffered) && ((zc->appliedParams).inBufferMode == ZSTD_bm_buffered)) {
    local_f8 = local_d8 + local_e8;
  }
  else {
    local_f8 = 0;
  }
  sVar10 = ZSTD_ldm_getMaxNbSeq((zc->appliedParams).ldmParams,local_e8);
  uVar1 = (zc->blockState).matchState.window.base;
  uVar2 = (zc->blockState).matchState.window.dictBase;
  uVar3 = (zc->blockState).matchState.window.dictLimit;
  uVar4 = (zc->blockState).matchState.window.lowLimit;
  uVar5 = (zc->blockState).matchState.window.nbOverflowCorrections;
  uVar6 = *(undefined4 *)&(zc->blockState).matchState.window.field_0x24;
  w.lowLimit = uVar6;
  w.dictLimit = uVar5;
  w.dictBase._4_4_ = uVar4;
  w.dictBase._0_4_ = uVar3;
  w.base = (BYTE *)uVar2;
  w.nextSrc = (BYTE *)uVar1;
  w._32_6_ = in_stack_ffffffffffffff00;
  w._38_1_ = in_stack_ffffffffffffff06;
  w._39_1_ = in_stack_ffffffffffffff07;
  iVar7 = ZSTD_indexTooCloseToMax(w);
  iVar8 = ZSTD_dictTooBig(loadedDictSize);
  bVar20 = true;
  if ((iVar7 == 0) && (bVar20 = true, iVar8 == 0)) {
    bVar20 = zc->initialized == 0;
  }
  neededSpace._4_4_ = (ZSTD_indexResetPolicy_e)bVar20;
  sVar11 = ZSTD_estimateCCtxSize_usingCCtxParams_internal
                     (&(zc->appliedParams).cParams,&(zc->appliedParams).ldmParams,
                      (uint)(zc->staticSize != 0),(zc->appliedParams).useRowMatchFinder,local_f8,
                      local_f0,pledgedSrcSize);
  uVar9 = ERR_isError(sVar11);
  if (uVar9 != 0) {
    return sVar11;
  }
  if (zc->staticSize == 0) {
    ZSTD_cwksp_bump_oversized_duration(ws_00,0);
  }
  sVar12 = ZSTD_cwksp_sizeof(ws_00);
  iVar7 = ZSTD_cwksp_check_wasteful(ws_00,sVar11);
  if (sVar12 < sVar11 || iVar7 != 0) {
    if (zc->staticSize != 0) {
      return 0xffffffffffffffc0;
    }
    neededSpace._4_4_ = ZSTDirp_reset;
    ZSTD_cwksp_free(ws_00,zc->customMem);
    sVar11 = ZSTD_cwksp_create(ws_00,sVar11,zc->customMem);
    uVar9 = ERR_isError(sVar11);
    if (uVar9 != 0) {
      return sVar11;
    }
    pZVar13 = (ZSTD_compressedBlockState_t *)ZSTD_cwksp_reserve_object(ws_00,0x11f0);
    (zc->blockState).prevCBlock = pZVar13;
    if ((zc->blockState).prevCBlock == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
    pZVar13 = (ZSTD_compressedBlockState_t *)ZSTD_cwksp_reserve_object(ws_00,0x11f0);
    (zc->blockState).nextCBlock = pZVar13;
    if ((zc->blockState).nextCBlock == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
    pUVar14 = (U32 *)ZSTD_cwksp_reserve_object(ws_00,0x19d8);
    zc->entropyWorkspace = pUVar14;
    if ((zc->blockState).nextCBlock == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
  }
  ZSTD_cwksp_clear(ws_00);
  uVar9 = (zc->appliedParams).cParams.chainLog;
  (zc->blockState).matchState.cParams.windowLog = (zc->appliedParams).cParams.windowLog;
  (zc->blockState).matchState.cParams.chainLog = uVar9;
  uVar9 = (zc->appliedParams).cParams.searchLog;
  (zc->blockState).matchState.cParams.hashLog = (zc->appliedParams).cParams.hashLog;
  (zc->blockState).matchState.cParams.searchLog = uVar9;
  uVar9 = (zc->appliedParams).cParams.targetLength;
  (zc->blockState).matchState.cParams.minMatch = (zc->appliedParams).cParams.minMatch;
  (zc->blockState).matchState.cParams.targetLength = uVar9;
  (zc->blockState).matchState.cParams.strategy = (zc->appliedParams).cParams.strategy;
  zc->pledgedSrcSizePlusOne = pledgedSrcSize + 1;
  zc->consumedSrcSize = 0;
  zc->producedCSize = 0;
  if (pledgedSrcSize == 0xffffffffffffffff) {
    (zc->appliedParams).fParams.contentSizeFlag = 0;
  }
  zc->blockSize = local_e8;
  XXH64_reset(&zc->xxhState,0);
  zc->stage = ZSTDcs_init;
  zc->dictID = 0;
  zc->dictContentSize = 0;
  ZSTD_reset_compressedBlockState((zc->blockState).prevCBlock);
  pBVar15 = ZSTD_cwksp_reserve_buffer(ws_00,local_e8 + 0x20);
  (zc->seqStore).litStart = pBVar15;
  (zc->seqStore).maxNbLit = local_e8;
  zc->bufferedPolicy = zbuff;
  zc->inBuffSize = local_f8;
  pBVar15 = ZSTD_cwksp_reserve_buffer(ws_00,local_f8);
  zc->inBuff = (char *)pBVar15;
  zc->outBuffSize = local_f0;
  pBVar15 = ZSTD_cwksp_reserve_buffer(ws_00,local_f0);
  zc->outBuff = (char *)pBVar15;
  if ((zc->appliedParams).ldmParams.enableLdm != 0) {
    bytes_00 = 1L << ((char)(zc->appliedParams).ldmParams.hashLog -
                      (char)(zc->appliedParams).ldmParams.bucketSizeLog & 0x3fU);
    pBVar15 = ZSTD_cwksp_reserve_buffer(ws_00,bytes_00);
    (zc->ldmState).bucketOffsets = pBVar15;
    memset((zc->ldmState).bucketOffsets,0,bytes_00);
  }
  ZSTD_referenceExternalSequences(zc,(rawSeq *)0x0,0);
  (zc->seqStore).maxNbSeq = bytes;
  pBVar15 = ZSTD_cwksp_reserve_buffer(ws_00,bytes);
  (zc->seqStore).llCode = pBVar15;
  pBVar15 = ZSTD_cwksp_reserve_buffer(ws_00,bytes);
  (zc->seqStore).mlCode = pBVar15;
  pBVar15 = ZSTD_cwksp_reserve_buffer(ws_00,bytes);
  (zc->seqStore).ofCode = pBVar15;
  psVar16 = (seqDef *)ZSTD_cwksp_reserve_aligned(ws_00,bytes << 3);
  (zc->seqStore).sequencesStart = psVar16;
  zc_local = (ZSTD_CCtx *)
             ZSTD_reset_matchState
                       (&(zc->blockState).matchState,ws_00,&(zc->appliedParams).cParams,
                        (zc->appliedParams).useRowMatchFinder,crp,neededSpace._4_4_,
                        ZSTD_resetTarget_CCtx);
  uVar9 = ERR_isError((size_t)zc_local);
  if (uVar9 == 0) {
    if ((zc->appliedParams).ldmParams.enableLdm != 0) {
      lVar17 = 1L << ((byte)(zc->appliedParams).ldmParams.hashLog & 0x3f);
      plVar18 = (ldmEntry_t *)ZSTD_cwksp_reserve_aligned(ws_00,lVar17 << 3);
      (zc->ldmState).hashTable = plVar18;
      memset((zc->ldmState).hashTable,0,lVar17 << 3);
      prVar19 = (rawSeq *)ZSTD_cwksp_reserve_aligned(ws_00,sVar10 * 0xc);
      zc->ldmSequences = prVar19;
      zc->maxNbLdmSequences = sVar10;
      ZSTD_window_init(&(zc->ldmState).window);
      (zc->ldmState).loadedDictEnd = 0;
    }
    zc->initialized = 1;
    zc_local = (ZSTD_CCtx *)0x0;
  }
  return (size_t)zc_local;
}

Assistant:

static size_t ZSTD_resetCCtx_internal(ZSTD_CCtx* zc,
                                      ZSTD_CCtx_params const* params,
                                      U64 const pledgedSrcSize,
                                      size_t const loadedDictSize,
                                      ZSTD_compResetPolicy_e const crp,
                                      ZSTD_buffered_policy_e const zbuff)
{
    ZSTD_cwksp* const ws = &zc->workspace;
    DEBUGLOG(4, "ZSTD_resetCCtx_internal: pledgedSrcSize=%u, wlog=%u, useRowMatchFinder=%d",
                (U32)pledgedSrcSize, params->cParams.windowLog, (int)params->useRowMatchFinder);
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));

    zc->isFirstBlock = 1;

    /* Set applied params early so we can modify them for LDM,
     * and point params at the applied params.
     */
    zc->appliedParams = *params;
    params = &zc->appliedParams;

    assert(params->useRowMatchFinder != ZSTD_urm_auto);
    if (params->ldmParams.enableLdm) {
        /* Adjust long distance matching parameters */
        ZSTD_ldm_adjustParameters(&zc->appliedParams.ldmParams, &params->cParams);
        assert(params->ldmParams.hashLog >= params->ldmParams.bucketSizeLog);
        assert(params->ldmParams.hashRateLog < 32);
    }

    {   size_t const windowSize = MAX(1, (size_t)MIN(((U64)1 << params->cParams.windowLog), pledgedSrcSize));
        size_t const blockSize = MIN(ZSTD_BLOCKSIZE_MAX, windowSize);
        U32    const divider = (params->cParams.minMatch==3) ? 3 : 4;
        size_t const maxNbSeq = blockSize / divider;
        size_t const buffOutSize = (zbuff == ZSTDb_buffered && params->outBufferMode == ZSTD_bm_buffered)
                ? ZSTD_compressBound(blockSize) + 1
                : 0;
        size_t const buffInSize = (zbuff == ZSTDb_buffered && params->inBufferMode == ZSTD_bm_buffered)
                ? windowSize + blockSize
                : 0;
        size_t const maxNbLdmSeq = ZSTD_ldm_getMaxNbSeq(params->ldmParams, blockSize);

        int const indexTooClose = ZSTD_indexTooCloseToMax(zc->blockState.matchState.window);
        int const dictTooBig = ZSTD_dictTooBig(loadedDictSize);
        ZSTD_indexResetPolicy_e needsIndexReset =
            (indexTooClose || dictTooBig || !zc->initialized) ? ZSTDirp_reset : ZSTDirp_continue;

        size_t const neededSpace =
            ZSTD_estimateCCtxSize_usingCCtxParams_internal(
                &params->cParams, &params->ldmParams, zc->staticSize != 0, params->useRowMatchFinder,
                buffInSize, buffOutSize, pledgedSrcSize);
        int resizeWorkspace;

        FORWARD_IF_ERROR(neededSpace, "cctx size estimate failed!");

        if (!zc->staticSize) ZSTD_cwksp_bump_oversized_duration(ws, 0);

        {   /* Check if workspace is large enough, alloc a new one if needed */
            int const workspaceTooSmall = ZSTD_cwksp_sizeof(ws) < neededSpace;
            int const workspaceWasteful = ZSTD_cwksp_check_wasteful(ws, neededSpace);
            resizeWorkspace = workspaceTooSmall || workspaceWasteful;
            DEBUGLOG(4, "Need %zu B workspace", neededSpace);
            DEBUGLOG(4, "windowSize: %zu - blockSize: %zu", windowSize, blockSize);

            if (resizeWorkspace) {
                DEBUGLOG(4, "Resize workspaceSize from %zuKB to %zuKB",
                            ZSTD_cwksp_sizeof(ws) >> 10,
                            neededSpace >> 10);

                RETURN_ERROR_IF(zc->staticSize, memory_allocation, "static cctx : no resize");

                needsIndexReset = ZSTDirp_reset;

                ZSTD_cwksp_free(ws, zc->customMem);
                FORWARD_IF_ERROR(ZSTD_cwksp_create(ws, neededSpace, zc->customMem), "");

                DEBUGLOG(5, "reserving object space");
                /* Statically sized space.
                 * entropyWorkspace never moves,
                 * though prev/next block swap places */
                assert(ZSTD_cwksp_check_available(ws, 2 * sizeof(ZSTD_compressedBlockState_t)));
                zc->blockState.prevCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.prevCBlock == NULL, memory_allocation, "couldn't allocate prevCBlock");
                zc->blockState.nextCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.nextCBlock == NULL, memory_allocation, "couldn't allocate nextCBlock");
                zc->entropyWorkspace = (U32*) ZSTD_cwksp_reserve_object(ws, ENTROPY_WORKSPACE_SIZE);
                RETURN_ERROR_IF(zc->blockState.nextCBlock == NULL, memory_allocation, "couldn't allocate entropyWorkspace");
        }   }

        ZSTD_cwksp_clear(ws);

        /* init params */
        zc->blockState.matchState.cParams = params->cParams;
        zc->pledgedSrcSizePlusOne = pledgedSrcSize+1;
        zc->consumedSrcSize = 0;
        zc->producedCSize = 0;
        if (pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN)
            zc->appliedParams.fParams.contentSizeFlag = 0;
        DEBUGLOG(4, "pledged content size : %u ; flag : %u",
            (unsigned)pledgedSrcSize, zc->appliedParams.fParams.contentSizeFlag);
        zc->blockSize = blockSize;

        XXH64_reset(&zc->xxhState, 0);
        zc->stage = ZSTDcs_init;
        zc->dictID = 0;
        zc->dictContentSize = 0;

        ZSTD_reset_compressedBlockState(zc->blockState.prevCBlock);

        /* ZSTD_wildcopy() is used to copy into the literals buffer,
         * so we have to oversize the buffer by WILDCOPY_OVERLENGTH bytes.
         */
        zc->seqStore.litStart = ZSTD_cwksp_reserve_buffer(ws, blockSize + WILDCOPY_OVERLENGTH);
        zc->seqStore.maxNbLit = blockSize;

        /* buffers */
        zc->bufferedPolicy = zbuff;
        zc->inBuffSize = buffInSize;
        zc->inBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffInSize);
        zc->outBuffSize = buffOutSize;
        zc->outBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffOutSize);

        /* ldm bucketOffsets table */
        if (params->ldmParams.enableLdm) {
            /* TODO: avoid memset? */
            size_t const numBuckets =
                  ((size_t)1) << (params->ldmParams.hashLog -
                                  params->ldmParams.bucketSizeLog);
            zc->ldmState.bucketOffsets = ZSTD_cwksp_reserve_buffer(ws, numBuckets);
            ZSTD_memset(zc->ldmState.bucketOffsets, 0, numBuckets);
        }

        /* sequences storage */
        ZSTD_referenceExternalSequences(zc, NULL, 0);
        zc->seqStore.maxNbSeq = maxNbSeq;
        zc->seqStore.llCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.mlCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.ofCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.sequencesStart = (seqDef*)ZSTD_cwksp_reserve_aligned(ws, maxNbSeq * sizeof(seqDef));

        FORWARD_IF_ERROR(ZSTD_reset_matchState(
            &zc->blockState.matchState,
            ws,
            &params->cParams,
            params->useRowMatchFinder,
            crp,
            needsIndexReset,
            ZSTD_resetTarget_CCtx), "");

        /* ldm hash table */
        if (params->ldmParams.enableLdm) {
            /* TODO: avoid memset? */
            size_t const ldmHSize = ((size_t)1) << params->ldmParams.hashLog;
            zc->ldmState.hashTable = (ldmEntry_t*)ZSTD_cwksp_reserve_aligned(ws, ldmHSize * sizeof(ldmEntry_t));
            ZSTD_memset(zc->ldmState.hashTable, 0, ldmHSize * sizeof(ldmEntry_t));
            zc->ldmSequences = (rawSeq*)ZSTD_cwksp_reserve_aligned(ws, maxNbLdmSeq * sizeof(rawSeq));
            zc->maxNbLdmSequences = maxNbLdmSeq;

            ZSTD_window_init(&zc->ldmState.window);
            zc->ldmState.loadedDictEnd = 0;
        }

        assert(ZSTD_cwksp_estimated_space_within_bounds(ws, neededSpace, resizeWorkspace));
        DEBUGLOG(3, "wksp: finished allocating, %zd bytes remain available", ZSTD_cwksp_available_space(ws));

        zc->initialized = 1;

        return 0;
    }
}